

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createQuadSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppQVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  iterator iVar5;
  undefined8 uVar6;
  uint uVar7;
  Node *pNVar8;
  int iVar9;
  QuadMeshNode *this_00;
  Vec3fa *pVVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float phif;
  uint p00;
  Quad local_b8;
  float local_a8;
  float local_a4;
  ulong local_a0;
  ulong local_98;
  int local_8c;
  float local_88;
  float local_84;
  size_t local_80;
  QuadMeshNode *local_78;
  ulong local_70;
  ulong local_68;
  Ref<embree::SceneGraph::MaterialNode> local_60;
  float local_58;
  uint local_54;
  Node *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_a4 = radius;
  local_80 = N;
  this_00 = (QuadMeshNode *)operator_new(0xd8);
  local_60 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  QuadMeshNode::QuadMeshNode(this_00,&local_60,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_78 = this_00;
  local_50 = (Node *)this;
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  iVar11 = (int)local_80;
  uVar7 = iVar11 * 2;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar19 = (ulong)((iVar11 + 1) * uVar7);
  uVar14 = pvVar4->size_alloced;
  uVar16 = uVar14;
  if ((uVar14 < uVar19) && (uVar16 = uVar19, uVar15 = uVar14, uVar14 != 0)) {
    do {
      uVar16 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
      uVar15 = uVar16;
    } while (uVar16 < uVar19);
  }
  if (uVar19 < pvVar4->size_active) {
    pvVar4->size_active = uVar19;
  }
  if (uVar14 == uVar16) {
    pvVar4->size_active = uVar19;
  }
  else {
    ptr = pvVar4->items;
    pVVar10 = (Vec3fa *)alignedMalloc(uVar16 << 4,0x10);
    pvVar4->items = pVVar10;
    if (pvVar4->size_active != 0) {
      lVar17 = 0;
      uVar14 = 0;
      do {
        puVar3 = (undefined8 *)((long)&ptr->field_0 + lVar17);
        uVar6 = puVar3[1];
        puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar17);
        *puVar2 = *puVar3;
        puVar2[1] = uVar6;
        uVar14 = uVar14 + 1;
        lVar17 = lVar17 + 0x10;
      } while (uVar14 < pvVar4->size_active);
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar19;
    pvVar4->size_alloced = uVar16;
  }
  fVar20 = (float)uVar7;
  auVar22 = rcpss(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
  local_88 = (2.0 - fVar20 * auVar22._0_4_) * auVar22._0_4_;
  fVar20 = (float)(local_80 & 0xffffffff);
  auVar22 = rcpss(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
  local_58 = (2.0 - fVar20 * auVar22._0_4_) * auVar22._0_4_;
  local_40 = (ulong)(uVar7 - 1);
  local_78 = (QuadMeshNode *)&local_78->quads;
  local_54 = uVar7 * (int)local_80;
  local_38 = (ulong)(((int)local_80 + -1) * uVar7);
  local_70 = (ulong)(uint)(iVar11 * -2);
  local_8c = 0;
  lVar17 = 0;
  uVar14 = 0;
  local_68 = local_70;
  local_48 = (ulong)uVar7;
  do {
    uVar16 = local_48;
    local_a0 = uVar14;
    if (uVar7 != 0) {
      local_98 = CONCAT44(local_98._4_4_,(float)uVar14 * 3.1415927 * local_58);
      uVar14 = 0;
      do {
        local_84 = ((float)(uVar14 & 0xffffffff) + (float)(uVar14 & 0xffffffff)) * 3.1415927 *
                   local_88;
        fVar20 = (center->field_0).m128[0];
        local_a8 = sinf((float)local_98);
        local_a8 = local_a8 * local_a4;
        fVar21 = sinf(local_84);
        uVar18 = (int)lVar17 + (int)uVar14;
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[0] =
             fVar21 * local_a8 + fVar20;
        fVar20 = (center->field_0).m128[1];
        fVar21 = cosf((float)local_98);
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[1] =
             fVar21 * local_a4 + fVar20;
        fVar20 = (center->field_0).m128[2];
        local_a8 = sinf((float)local_98);
        local_a8 = local_a8 * local_a4;
        fVar21 = cosf(local_84);
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[2] =
             fVar21 * local_a8 + fVar20;
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
    }
    if ((int)local_a0 != 0) {
      uVar18 = (uint)local_40;
      if ((int)local_a0 == 1) {
        if (uVar7 != 0) {
          iVar11 = 1;
          do {
            local_b8.v0 = uVar18 + iVar11;
            iVar9 = iVar11;
            if ((int)local_70 + iVar11 == 0) {
              iVar9 = 0;
            }
            local_b8.v2 = iVar9 + uVar7;
            iVar5._M_current =
                 (this_00->quads).
                 super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_b8.v1 = uVar18;
            local_b8.v3 = local_b8.v2;
            if (iVar5._M_current ==
                (this_00->quads).
                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>
                        ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)local_78,iVar5,&local_b8);
            }
            else {
              (iVar5._M_current)->v0 = local_b8.v0;
              (iVar5._M_current)->v1 = uVar18;
              (iVar5._M_current)->v2 = local_b8.v2;
              (iVar5._M_current)->v3 = local_b8.v2;
              ppQVar1 = &(this_00->quads).
                         super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppQVar1 = *ppQVar1 + 1;
            }
            iVar9 = (int)local_70 + iVar11;
            iVar11 = iVar11 + 1;
          } while (iVar9 != 0);
        }
      }
      else if ((int)local_a0 == (uint)local_80) {
        if (uVar7 != 0) {
          iVar11 = 1;
          do {
            local_b8.v1 = ((int)local_38 + iVar11) - 1;
            iVar9 = iVar11;
            if ((int)local_70 + iVar11 == 0) {
              iVar9 = 0;
            }
            local_b8.v2 = iVar9 + (int)local_38;
            local_b8.v0 = local_54;
            iVar5._M_current =
                 (this_00->quads).
                 super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_b8.v3 = local_b8.v2;
            if (iVar5._M_current ==
                (this_00->quads).
                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>
                        ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)local_78,iVar5,&local_b8);
            }
            else {
              (iVar5._M_current)->v0 = local_54;
              (iVar5._M_current)->v1 = local_b8.v1;
              (iVar5._M_current)->v2 = local_b8.v2;
              (iVar5._M_current)->v3 = local_b8.v2;
              ppQVar1 = &(this_00->quads).
                         super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppQVar1 = *ppQVar1 + 1;
            }
            iVar9 = (int)local_70 + iVar11;
            iVar11 = iVar11 + 1;
          } while (iVar9 != 0);
        }
      }
      else if (uVar7 != 0) {
        local_98 = (ulong)(((int)local_a0 + -1) * uVar7);
        iVar11 = (int)local_a0 * uVar7;
        uVar12 = 0;
        do {
          uVar13 = uVar12 + 1;
          local_b8.v1 = (int)local_68 + uVar12;
          local_b8.v3 = uVar13;
          if (uVar18 == uVar12) {
            local_b8.v3 = 0;
          }
          local_b8.v2 = (int)local_98 + local_b8.v3;
          local_b8.v0 = uVar12 + local_8c;
          local_b8.v3 = local_b8.v3 + iVar11;
          iVar5._M_current =
               (this_00->quads).
               super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this_00->quads).
              super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad>
                      ((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                        *)local_78,iVar5,&local_b8);
          }
          else {
            (iVar5._M_current)->v0 = local_b8.v0;
            (iVar5._M_current)->v1 = local_b8.v1;
            (iVar5._M_current)->v2 = local_b8.v2;
            (iVar5._M_current)->v3 = local_b8.v3;
            ppQVar1 = &(this_00->quads).
                       super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppQVar1 = *ppQVar1 + 1;
          }
          uVar12 = uVar13;
        } while (uVar7 != uVar13);
      }
    }
    pNVar8 = local_50;
    uVar18 = (int)local_a0 + 1;
    uVar14 = (ulong)uVar18;
    lVar17 = lVar17 + local_48;
    local_68 = (ulong)((int)local_68 + uVar7);
    local_8c = local_8c + uVar7;
  } while (uVar18 <= (uint)local_80);
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar8;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createQuadSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p11,p11));
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p01,p01));
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p01,p11));
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }